

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

base_learner * GD::setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  size_t *psVar2;
  _func_float_gd_ptr_base_learner_ptr_example_ptr *p_Var3;
  undefined8 uVar4;
  double dVar5;
  _Head_base<0UL,_GD::gd_*,_false> _Var6;
  options_i *this;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  option_group_definition *poVar11;
  typed_option<float> *op;
  typed_option<double> *ptVar12;
  typed_option<unsigned_long> *ptVar13;
  size_t sVar14;
  ostream *poVar15;
  code *pcVar16;
  uint64_t uVar17;
  learner<GD::gd,_example> *plVar18;
  vw_exception *this_00;
  code *pcVar19;
  uint32_t *puVar20;
  code *pcVar21;
  bool bVar22;
  byte bVar23;
  bool bVar24;
  float fVar25;
  bool normalized;
  bool invariant;
  bool adaptive;
  bool adax;
  bool sgd;
  free_ptr<GD::gd> g;
  option_group_definition new_options;
  stringstream __msg;
  bool local_8ad;
  bool local_8ac;
  bool local_8ab;
  bool local_8aa;
  bool local_8a9;
  free_ptr<GD::gd> local_8a8;
  options_i *local_898;
  string local_890;
  undefined1 *local_870 [2];
  undefined1 local_860 [16];
  string local_850;
  undefined1 *local_830 [2];
  undefined1 local_820 [16];
  string local_810;
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  string local_7d0;
  undefined1 *local_7b0 [2];
  undefined1 local_7a0 [16];
  string local_790;
  undefined1 *local_770 [2];
  undefined1 local_760 [16];
  string local_750;
  undefined1 *local_730 [2];
  undefined1 local_720 [16];
  string local_710;
  undefined1 *local_6f0;
  long local_6e8;
  undefined1 local_6e0 [16];
  option_group_definition local_6d0;
  undefined1 *local_698 [2];
  undefined1 local_688 [16];
  undefined1 *local_678 [2];
  undefined1 local_668 [16];
  string local_658;
  string local_638;
  undefined1 local_618 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_590;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_580;
  undefined1 local_578 [48];
  string local_548 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  typed_option<double> local_210;
  typed_option<double> local_170;
  typed_option<float> local_d0;
  
  local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl = calloc_or_throw<GD::gd>(1);
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->early_stop_thres = 0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->initial_constant = 0.0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_norm_power = 0.0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_power_t = 0.0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->sparse_l2 = 0.0;
  *(undefined8 *)
   &(local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->update_multiplier = 0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->predict = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->learn = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->update = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->sensitivity = (_func_float_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->multipredict =
       (_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool *)0x0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->normalized = false;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adaptive = false;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adax = false;
  *(undefined5 *)
   &(local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->field_0x5b = 0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->all = (vw *)0x0;
  local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<GD::gd>;
  local_8a9 = false;
  local_8ab = false;
  local_8aa = false;
  local_8ac = false;
  local_8ad = false;
  local_6f0 = local_6e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f0,"Gradient Descent options","");
  local_6d0.m_name._M_dataplus._M_p = (pointer)&local_6d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_6d0,local_6f0,local_6f0 + local_6e8);
  local_6d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6f0 != local_6e0) {
    operator_delete(local_6f0);
  }
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"sgd","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_578,&local_710,&local_8a9);
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_730,"use regular stochastic gradient descent update.","");
  std::__cxx11::string::_M_assign(local_548);
  poVar11 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (&local_6d0,(typed_option<bool> *)local_578);
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"adaptive","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_618,&local_750,&local_8ab);
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_770,"use adaptive, individual learning rates.","");
  std::__cxx11::string::_M_assign((string *)(local_618 + 0x30));
  poVar11 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar11,(typed_option<bool> *)local_618);
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"adax","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_790,&local_8aa);
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7b0,"use adaptive learning rates with x^2 instead of g^2x^2","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar11 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar11,(typed_option<bool> *)local_2b0);
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"invariant","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_7d0,&local_8ac);
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7f0,"use safe/importance aware updates.","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar11 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar11,(typed_option<bool> *)local_350);
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"normalized","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_810,&local_8ad);
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_830,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar11 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar11,(typed_option<bool> *)local_3f0);
  local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"sparse_l2","");
  VW::config::typed_option<float>::typed_option
            (&local_d0,&local_850,
             &(local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->sparse_l2);
  local_898 = options;
  op = VW::config::typed_option<float>::default_value(&local_d0,0.0);
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_870,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar11 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar11,op);
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"l1_state","");
  VW::config::typed_option<double>::typed_option(&local_170,&local_658,&all->sd->gravity);
  local_170.super_base_option.m_keep = all->save_resume;
  ptVar12 = VW::config::typed_option<double>::default_value(&local_170,0.0);
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_678,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  poVar11 = VW::config::option_group_definition::add<VW::config::typed_option<double>&>
                      (poVar11,ptVar12);
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"l2_state","");
  VW::config::typed_option<double>::typed_option(&local_210,&local_890,&all->sd->contraction);
  local_210.super_base_option.m_keep = all->save_resume;
  ptVar12 = VW::config::typed_option<double>::default_value(&local_210,1.0);
  local_698[0] = local_688;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_698,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<double>&>(poVar11,ptVar12);
  if (local_698[0] != local_688) {
    operator_delete(local_698[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002db168;
  if (local_210.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p);
  }
  if (local_678[0] != local_668) {
    operator_delete(local_678[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002db168;
  if (local_170.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if (local_870[0] != local_860) {
    operator_delete(local_870[0]);
  }
  this = local_898;
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002db0f8;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p);
  }
  if (local_830[0] != local_820) {
    operator_delete(local_830[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002dafe8;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002dafe8;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  if (local_7b0[0] != local_7a0) {
    operator_delete(local_7b0[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002dafe8;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p);
  }
  if (local_770[0] != local_760) {
    operator_delete(local_770[0]);
  }
  local_618._0_8_ = &PTR__typed_option_002dafe8;
  if (local_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_580._M_pi);
  }
  if (local_590._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_590._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p);
  }
  if (local_730[0] != local_720) {
    operator_delete(local_730[0]);
  }
  local_578._0_8_ = &PTR__typed_option_002dafe8;
  if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0._M_pi);
  }
  if (local_4f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p);
  }
  (**this->_vptr_options_i)(this,&local_6d0);
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->all = all;
  all->normalized_sum_norm_x = 0.0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  fVar25 = -1.0;
  if (all->adaptive != false) {
    fVar25 = all->power_t + -1.0;
  }
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_norm_power = fVar25;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_power_t = -all->power_t;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adaptive = all->adaptive;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->normalized = all->normalized_updates;
  if (0.0 < all->initial_t) {
    (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->all->normalized_sum_norm_x = (double)all->initial_t;
    (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->total_weight = (double)all->initial_t;
  }
  pp_Var1 = (_func_int **)(local_578 + 0x10);
  local_578._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"feature_mask","");
  iVar8 = (*this->_vptr_options_i[1])(this,local_578);
  if ((_func_int **)local_578._0_8_ != pp_Var1) {
    operator_delete((void *)local_578._0_8_);
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_578._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"early_terminate","");
    ptVar13 = VW::config::options_i::get_typed_option<unsigned_long>(this,(string *)local_578);
    psVar2 = (ptVar13->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (psVar2 == (size_t *)0x0) {
      sVar14 = 0;
    }
    else {
      sVar14 = *psVar2;
    }
    (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->early_stop_thres = sVar14;
    if ((_func_int **)local_578._0_8_ != pp_Var1) {
      operator_delete((void *)local_578._0_8_);
    }
  }
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->initial_constant = all->initial_constant;
  if ((((local_8a9 == false) && (local_8ab == false)) && (local_8ac == false)) &&
     (local_8ad != true)) {
    bVar22 = all->training;
    all->adaptive = bVar22;
    all->invariant_updates = bVar22;
    all->normalized_updates = bVar22;
  }
  else {
    bVar24 = all->training == false;
    bVar7 = false;
    bVar22 = local_8ab;
    if (bVar24) {
      bVar22 = bVar7;
    }
    all->adaptive = bVar22;
    bVar22 = local_8ac;
    if (bVar24) {
      bVar22 = bVar7;
    }
    all->invariant_updates = bVar22;
    bVar22 = local_8ad;
    if (bVar24) {
      bVar22 = bVar7;
    }
    all->normalized_updates = bVar22;
    local_578._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"learning_rate","");
    iVar9 = (*this->_vptr_options_i[1])(this,local_578);
    if ((char)iVar9 == '\0') {
      local_618._0_8_ = local_618 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"l","");
      iVar10 = (*this->_vptr_options_i[1])(this,local_618);
      if ((char)iVar10 != '\0') goto LAB_0013fc99;
      bVar23 = all->normalized_updates & all->adaptive ^ 1;
    }
    else {
LAB_0013fc99:
      bVar23 = 0;
    }
    if (((char)iVar9 == '\0') && ((undefined1 *)local_618._0_8_ != local_618 + 0x10)) {
      operator_delete((void *)local_618._0_8_);
    }
    if ((_func_int **)local_578._0_8_ != pp_Var1) {
      operator_delete((void *)local_578._0_8_);
    }
    if (bVar23 != 0) {
      all->eta = 10.0;
    }
    if ((all->adaptive == false) && (all->normalized_updates == false)) {
      local_578._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"initial_t","");
      iVar9 = (*this->_vptr_options_i[1])(this,local_578);
      if ((_func_int **)local_578._0_8_ != pp_Var1) {
        operator_delete((void *)local_578._0_8_);
      }
      if ((char)iVar9 == '\0') {
        all->sd->t = 1.0;
        all->initial_t = 1.0;
      }
      fVar25 = powf((float)all->sd->t,all->power_t);
      all->eta = fVar25 * all->eta;
    }
  }
  if (local_8aa == true) {
    (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->adax = all->training;
  }
  if (((local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl)->adax == true) && (all->adaptive == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_578);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_578 + 0x10),"Cannot use adax without adaptive",0x20);
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
               ,0x48e,&local_638);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dVar5 = pow((double)all->eta_decay_rate,
              ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25)
              + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
  if (dVar5 < 0.0001) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "Warning: the learning rate for the last pass is multiplied by: ",0x3f);
    dVar5 = pow((double)all->eta_decay_rate,
                ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25
                ) + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
    poVar15 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15," adjust --decay_learning_rate larger to avoid this.",0x33);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  if ((all->reg_mode & 1) == 0) {
    if (all->audit != false) {
      pcVar16 = predict<false,true>;
      pcVar19 = multipredict<false,true>;
      goto LAB_0013ff3a;
    }
    pcVar16 = predict<false,false>;
    bVar22 = all->hash_inv == false;
    if (!bVar22) {
      pcVar16 = predict<false,true>;
    }
    pcVar21 = multipredict<false,true>;
    pcVar19 = multipredict<false,false>;
  }
  else {
    if (all->audit != false) {
      pcVar19 = multipredict<true,true>;
      pcVar16 = predict<true,true>;
      goto LAB_0013ff3a;
    }
    pcVar16 = predict<true,false>;
    bVar22 = all->hash_inv == false;
    if (!bVar22) {
      pcVar16 = predict<true,true>;
    }
    pcVar21 = multipredict<true,true>;
    pcVar19 = multipredict<true,false>;
  }
  if (!bVar22) {
    pcVar19 = pcVar21;
  }
LAB_0013ff3a:
  bVar22 = (bool)((byte)iVar8 ^ 1);
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->predict = pcVar16;
  (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->multipredict = pcVar19;
  if ((all->power_t != 0.5) || (NAN(all->power_t))) {
    uVar17 = set_learn<false>(all,bVar22,
                              local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  else {
    uVar17 = set_learn<true>(all,bVar22,
                             local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  uVar17 = ceil_log_2(uVar17 - 1);
  if ((all->weights).sparse == true) {
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,(uint32_t)uVar17);
  }
  else {
    (all->weights).dense_weights._stride_shift = (uint32_t)uVar17;
  }
  _Var6._M_head_impl =
       local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl;
  puVar20 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar20 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar18 = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                      (&local_8a8,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->learn,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->predict,
                       1L << ((byte)*puVar20 & 0x3f));
  p_Var3 = (_Var6._M_head_impl)->sensitivity;
  uVar4 = *(undefined8 *)(plVar18 + 0x18);
  *(undefined8 *)(plVar18 + 0x48) = uVar4;
  *(_func_float_gd_ptr_base_learner_ptr_example_ptr **)(plVar18 + 0x50) = p_Var3;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool **)
   (plVar18 + 0x40) = (_Var6._M_head_impl)->multipredict;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr **)(plVar18 + 0x38) =
       (_Var6._M_head_impl)->update;
  *(code **)(plVar18 + 0x80) = save_load;
  *(undefined8 *)(plVar18 + 0x70) = uVar4;
  *(undefined8 *)(plVar18 + 0x78) = *(undefined8 *)(plVar18 + 0x20);
  *(undefined8 *)(plVar18 + 0x88) = uVar4;
  *(undefined8 *)(plVar18 + 0x90) = *(undefined8 *)(plVar18 + 0x20);
  *(code **)(plVar18 + 0x98) = end_pass;
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_6d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.m_name._M_dataplus._M_p != &local_6d0.m_name.field_2) {
    operator_delete(local_6d0.m_name._M_dataplus._M_p);
  }
  if (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
      _M_head_impl != (gd *)0x0) {
    (*(code *)local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_8a8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar18;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}